

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O3

int ARKBandPrecGetNumRhsEvals(void *arkode_mem,long *nfevalsBP)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkLs_AccessARKODELMem(arkode_mem,"ARKBandPrecGetNumRhsEvals",&local_18,&local_20);
  if (iVar1 == 0) {
    if (local_20->P_data == (void *)0x0) {
      iVar1 = -5;
      arkProcessError(local_18,-5,0x10f,"ARKBandPrecGetNumRhsEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"Band preconditioner memory is NULL. ARKBandPrecInit must be called.");
    }
    else {
      *nfevalsBP = *(long *)((long)local_20->P_data + 0x40);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKBandPrecGetNumRhsEvals(void* arkode_mem, long int* nfevalsBP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBandPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BP_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBandPrecData)arkls_mem->P_data;

  /* set output */
  *nfevalsBP = pdata->nfeBP;

  return (ARKLS_SUCCESS);
}